

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

timestamp_t __thiscall duckdb::Value::GetValueInternal<duckdb::timestamp_t>(Value *this)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  date_t input;
  char *__s;
  bool bVar3;
  timestamp_t tVar4;
  string *psVar5;
  size_t sVar6;
  NotImplementedException *pNVar7;
  InternalException *pIVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  timestamp_t result;
  undefined1 in_stack_00000008 [16];
  LogicalType local_a8;
  Value local_90;
  uint local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  string local_40;
  
  if (this->is_null == true) {
    pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Calling GetValueInternal on a value that is NULL","");
    InternalException::InternalException(pIVar8,(string *)&local_90);
    __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  LVar1 = (this->type_).id_;
  switch(LVar1) {
  case BOOLEAN:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,BOOL,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TINYINT:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,INT8,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case SMALLINT:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,INT16,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case INTEGER:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,INT32,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case BIGINT:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,INT64,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case DATE:
    input.days = (this->value_).date.days;
    bVar3 = TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>
                      (input,(timestamp_t *)&local_a8,false);
    if (!bVar3) {
      auVar10 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                ((string *)&local_90,(duckdb *)(ulong)(uint)input.days,(date_t)auVar10._8_4_);
      InvalidInputException::InvalidInputException(auVar10._0_8_,(string *)&local_90);
      __cxa_throw(auVar10._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case TIME:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,INT64,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_SEC:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,INT64,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_MS:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,INT64,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP:
    tVar4.value = (this->value_).timestamp.value;
    bVar3 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>
                      (tVar4,(timestamp_t *)&local_a8,false);
    if (!bVar3) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                ((string *)&local_90,(duckdb *)tVar4.value,(timestamp_t)auVar9._8_8_);
      InvalidInputException::InvalidInputException(auVar9._0_8_,(string *)&local_90);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    break;
  case TIMESTAMP_NS:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,INT64,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case DECIMAL:
    LogicalType::LogicalType(&local_a8,DOUBLE);
    DefaultCastAs(&local_90,this,&local_a8,false);
    tVar4 = GetValueInternal<duckdb::timestamp_t>(&local_90);
    ~Value(&local_90);
    LogicalType::~LogicalType(&local_a8);
    local_a8._0_8_ = tVar4;
    break;
  case FLOAT:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,FLOAT,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case DOUBLE:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,DOUBLE,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case VARCHAR:
    psVar5 = StringValue::Get_abi_cxx11_(this);
    __s = (psVar5->_M_dataplus)._M_p;
    sVar6 = strlen(__s);
    local_50 = (uint)sVar6;
    if (local_50 < 0xd) {
      uStack_44 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      if (local_50 != 0) {
        switchD_012dd528::default(&uStack_4c,__s,(ulong)(local_50 & 0xf));
      }
    }
    else {
      uStack_4c = *(undefined4 *)__s;
      uStack_48 = SUB84(__s,0);
      uStack_44 = (undefined4)((ulong)__s >> 0x20);
    }
    tVar4 = Cast::Operation<duckdb::string_t,duckdb::timestamp_t>((string_t)in_stack_00000008);
    return (timestamp_t)tVar4.value;
  case INTERVAL:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,INTERVAL,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case UTINYINT:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,UINT8,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case USMALLINT:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,UINT16,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case UINTEGER:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,UINT32,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case UBIGINT:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,UINT64,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_TZ:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,INT64,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIME_TZ:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,INVALID,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case UHUGEINT:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,UINT128,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case HUGEINT:
  case UUID:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_a8.id_ = INTEGER_LITERAL;
    local_a8.physical_type_ = ~INVALID;
    local_a8._2_6_ = 0;
    local_90.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a8);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
    builtin_strncpy((char *)local_90.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_90.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    *(char *)(local_90.type_._0_8_ + local_a8._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar7,(string *)&local_90,INT128,INT64);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  default:
    if (LVar1 == ENUM) {
      PVar2 = (this->type_).physical_type_;
      if (PVar2 == UINT32) {
        tVar4 = Cast::Operation<unsigned_int,duckdb::timestamp_t>((this->value_).uinteger);
        return (timestamp_t)tVar4.value;
      }
      if (PVar2 == UINT16) {
        tVar4 = Cast::Operation<unsigned_short,duckdb::timestamp_t>((this->value_).usmallint);
        return (timestamp_t)tVar4.value;
      }
      if (PVar2 != UINT8) {
        pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
        local_90.type_._0_8_ =
             &local_90.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"Invalid Internal Type for ENUMs","");
        InternalException::InternalException(pIVar8,(string *)&local_90);
        __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      tVar4 = Cast::Operation<unsigned_char,duckdb::timestamp_t>((this->value_).utinyint);
      return (timestamp_t)tVar4.value;
    }
  case CHAR:
  case BLOB:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
    pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Unimplemented type \"%s\" for GetValue()","");
    LogicalType::ToString_abi_cxx11_(&local_40,&this->type_);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (pNVar7,(string *)&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
    __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return (timestamp_t)local_a8._0_8_;
}

Assistant:

T Value::GetValueInternal() const {
	if (IsNull()) {
		throw InternalException("Calling GetValueInternal on a value that is NULL");
	}
	switch (type_.id()) {
	case LogicalTypeId::BOOLEAN:
		return Cast::Operation<bool, T>(value_.boolean);
	case LogicalTypeId::TINYINT:
		return Cast::Operation<int8_t, T>(value_.tinyint);
	case LogicalTypeId::SMALLINT:
		return Cast::Operation<int16_t, T>(value_.smallint);
	case LogicalTypeId::INTEGER:
		return Cast::Operation<int32_t, T>(value_.integer);
	case LogicalTypeId::BIGINT:
		return Cast::Operation<int64_t, T>(value_.bigint);
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::UUID:
		return Cast::Operation<hugeint_t, T>(value_.hugeint);
	case LogicalTypeId::UHUGEINT:
		return Cast::Operation<uhugeint_t, T>(value_.uhugeint);
	case LogicalTypeId::DATE:
		return Cast::Operation<date_t, T>(value_.date);
	case LogicalTypeId::TIME:
		return Cast::Operation<dtime_t, T>(value_.time);
	case LogicalTypeId::TIME_TZ:
		return Cast::Operation<dtime_tz_t, T>(value_.timetz);
	case LogicalTypeId::TIMESTAMP:
		return Cast::Operation<timestamp_t, T>(value_.timestamp);
	case LogicalTypeId::TIMESTAMP_SEC:
		return Cast::Operation<timestamp_sec_t, T>(value_.timestamp_s);
	case LogicalTypeId::TIMESTAMP_MS:
		return Cast::Operation<timestamp_ms_t, T>(value_.timestamp_ms);
	case LogicalTypeId::TIMESTAMP_NS:
		return Cast::Operation<timestamp_ns_t, T>(value_.timestamp_ns);
	case LogicalTypeId::TIMESTAMP_TZ:
		return Cast::Operation<timestamp_tz_t, T>(value_.timestamp_tz);
	case LogicalTypeId::UTINYINT:
		return Cast::Operation<uint8_t, T>(value_.utinyint);
	case LogicalTypeId::USMALLINT:
		return Cast::Operation<uint16_t, T>(value_.usmallint);
	case LogicalTypeId::UINTEGER:
		return Cast::Operation<uint32_t, T>(value_.uinteger);
	case LogicalTypeId::UBIGINT:
		return Cast::Operation<uint64_t, T>(value_.ubigint);
	case LogicalTypeId::FLOAT:
		return Cast::Operation<float, T>(value_.float_);
	case LogicalTypeId::DOUBLE:
		return Cast::Operation<double, T>(value_.double_);
	case LogicalTypeId::VARCHAR:
		return Cast::Operation<string_t, T>(StringValue::Get(*this).c_str());
	case LogicalTypeId::INTERVAL:
		return Cast::Operation<interval_t, T>(value_.interval);
	case LogicalTypeId::DECIMAL:
		return DefaultCastAs(LogicalType::DOUBLE).GetValueInternal<T>();
	case LogicalTypeId::ENUM: {
		switch (type_.InternalType()) {
		case PhysicalType::UINT8:
			return Cast::Operation<uint8_t, T>(value_.utinyint);
		case PhysicalType::UINT16:
			return Cast::Operation<uint16_t, T>(value_.usmallint);
		case PhysicalType::UINT32:
			return Cast::Operation<uint32_t, T>(value_.uinteger);
		default:
			throw InternalException("Invalid Internal Type for ENUMs");
		}
	}
	default:
		throw NotImplementedException("Unimplemented type \"%s\" for GetValue()", type_.ToString());
	}
}